

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O1

void llvm::sys::RunSignalHandlers(void)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0x10;
  do {
    piVar1 = (int *)((long)&CallBacksToRun[0].Callback + lVar2);
    LOCK();
    bVar3 = *piVar1 == 2;
    if (bVar3) {
      *piVar1 = 3;
    }
    UNLOCK();
    if (bVar3) {
      (**(code **)((long)&commandLineFitsWithinSystemLimits::ArgMax + lVar2))
                (*(undefined8 *)
                  (&commandLineFitsWithinSystemLimits(llvm::StringRef,llvm::ArrayRef<llvm::StringRef>)
                    ::ArgMax + lVar2));
      *(undefined8 *)((long)&commandLineFitsWithinSystemLimits::ArgMax + lVar2) = 0;
      *(undefined8 *)
       (&commandLineFitsWithinSystemLimits(llvm::StringRef,llvm::ArrayRef<llvm::StringRef>)::ArgMax
       + lVar2) = 0;
      LOCK();
      *(undefined4 *)((long)&CallBacksToRun[0].Callback + lVar2) = 0;
      UNLOCK();
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xd0);
  return;
}

Assistant:

void sys::RunSignalHandlers() {
  for (size_t I = 0; I < MaxSignalHandlerCallbacks; ++I) {
    auto &RunMe = CallBacksToRun[I];
    auto Expected = CallbackAndCookie::Status::Initialized;
    auto Desired = CallbackAndCookie::Status::Executing;
    if (!RunMe.Flag.compare_exchange_strong(Expected, Desired))
      continue;
    (*RunMe.Callback)(RunMe.Cookie);
    RunMe.Callback = nullptr;
    RunMe.Cookie = nullptr;
    RunMe.Flag.store(CallbackAndCookie::Status::Empty);
  }
}